

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServiceRequestPdu.cpp
# Opt level: O0

void __thiscall DIS::ServiceRequestPdu::~ServiceRequestPdu(ServiceRequestPdu *this)

{
  ServiceRequestPdu *this_local;
  
  (this->super_LogisticsFamilyPdu).super_Pdu.super_PduSuperclass._vptr_PduSuperclass =
       (_func_int **)&PTR__ServiceRequestPdu_00268ec8;
  std::vector<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>::clear(&this->_supplies);
  std::vector<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>::~vector(&this->_supplies);
  EntityID::~EntityID(&this->_servicingEntityID);
  EntityID::~EntityID(&this->_requestingEntityID);
  LogisticsFamilyPdu::~LogisticsFamilyPdu(&this->super_LogisticsFamilyPdu);
  return;
}

Assistant:

ServiceRequestPdu::~ServiceRequestPdu()
{
    _supplies.clear();
}